

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall
fasttext::FastText::printInfo(FastText *this,real progress,real loss,ostream *log_stream)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 in_XMM4_Qa;
  float fVar12;
  undefined8 in_XMM7_Qb;
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  auVar7 = vpmovsxdq_avx(ZEXT816(0x278d0000000000));
  dVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lr;
  fVar12 = progress;
  if ((0.0 < progress) &&
     (dVar8 = (double)(lVar3 - (this->start_).__d.__r) / 1000000000.0, 0.0 <= dVar8)) {
    fVar12 = progress * 100.0;
    auVar11._0_8_ = (double)fVar12;
    auVar11._8_8_ = 0;
    auVar7._0_8_ = (double)(this->tokenCount_).super___atomic_base<long>._M_i / dVar8;
    auVar7._8_8_ = in_XMM4_Qa;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar8 * (double)(100.0 - fVar12);
    auVar7 = vunpcklpd_avx(auVar7,auVar9);
    auVar10._0_8_ =
         (double)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->thread;
    auVar10._8_8_ = in_XMM7_Qb;
    auVar9 = vunpcklpd_avx(auVar10,auVar11);
    auVar7 = vdivpd_avx(auVar7,auVar9);
    auVar7 = vcvttpd2qq_avx512vl(auVar7);
  }
  lVar3 = vpextrq_avx(auVar7,1);
  iVar6 = (int)(SUB168(SEXT816(lVar3) * SEXT816(0x48d159e26af37c05),8) >> 10) -
          (SUB164(SEXT816(lVar3) * SEXT816(0x48d159e26af37c05),0xc) >> 0x1f);
  iVar5 = (int)lVar3 + iVar6 * -0xe10;
  uVar2 = ((uint)((short)iVar5 * -0x7777) >> 0x10) + iVar5;
  *(uint *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x18) =
       *(uint *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x18) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>(log_stream,"Progress: ",10);
  lVar3 = *(long *)log_stream;
  *(undefined8 *)(log_stream + *(long *)(lVar3 + -0x18) + 8) = 1;
  *(undefined8 *)(log_stream + *(long *)(lVar3 + -0x18) + 0x10) = 5;
  poVar4 = std::ostream::_M_insert<double>((double)fVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%",1);
  std::__ostream_insert<char,std::char_traits<char>>(log_stream," words/sec/thread: ",0x13);
  *(undefined8 *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x10) = 7;
  std::ostream::_M_insert<long>((long)log_stream);
  std::__ostream_insert<char,std::char_traits<char>>(log_stream," lr: ",5);
  lVar3 = *(long *)log_stream;
  *(undefined8 *)(log_stream + *(long *)(lVar3 + -0x18) + 0x10) = 9;
  *(undefined8 *)(log_stream + *(long *)(lVar3 + -0x18) + 8) = 6;
  std::ostream::_M_insert<double>((1.0 - (double)progress) * dVar1);
  std::__ostream_insert<char,std::char_traits<char>>(log_stream," loss: ",7);
  lVar3 = *(long *)log_stream;
  *(undefined8 *)(log_stream + *(long *)(lVar3 + -0x18) + 0x10) = 9;
  *(undefined8 *)(log_stream + *(long *)(lVar3 + -0x18) + 8) = 6;
  std::ostream::_M_insert<double>((double)loss);
  std::__ostream_insert<char,std::char_traits<char>>(log_stream," ETA: ",6);
  *(undefined8 *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x10) = 3;
  std::ostream::operator<<((ostream *)log_stream,iVar6);
  std::__ostream_insert<char,std::char_traits<char>>(log_stream,"h",1);
  *(undefined8 *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x10) = 2;
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)log_stream,
                      (int)(short)(((short)uVar2 >> 5) + (short)((uVar2 & 0xffff) >> 0xf)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"m",1);
  std::ostream::flush();
  return;
}

Assistant:

void FastText::printInfo(real progress, real loss, std::ostream& log_stream) {
  std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();
  double t =
      std::chrono::duration_cast<std::chrono::duration<double>>(end - start_)
          .count();
  double lr = args_->lr * (1.0 - progress);
  double wst = 0;

  int64_t eta = 2592000; // Default to one month in seconds (720 * 3600)

  if (progress > 0 && t >= 0) {
    progress = progress * 100;
    eta = t * (100 - progress) / progress;
    wst = double(tokenCount_) / t / args_->thread;
  }
  int32_t etah = eta / 3600;
  int32_t etam = (eta % 3600) / 60;

  log_stream << std::fixed;
  log_stream << "Progress: ";
  log_stream << std::setprecision(1) << std::setw(5) << progress << "%";
  log_stream << " words/sec/thread: " << std::setw(7) << int64_t(wst);
  log_stream << " lr: " << std::setw(9) << std::setprecision(6) << lr;
  log_stream << " loss: " << std::setw(9) << std::setprecision(6) << loss;
  log_stream << " ETA: " << std::setw(3) << etah;
  log_stream << "h" << std::setw(2) << etam << "m";
  log_stream << std::flush;
}